

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

void __thiscall masc::polygon::c_polygon::destroy(c_polygon *this)

{
  pointer pppVar1;
  c_polygon *pcVar2;
  
  pcVar2 = this;
  while (pcVar2 = (c_polygon *)
                  (pcVar2->super_c_plylist).
                  super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                  super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                  _M_impl._M_node.super__List_node_base._M_next, pcVar2 != this) {
    c_ply::destroy((c_ply *)&(pcVar2->super_c_plylist).
                             super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                             .
                             super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                             ._M_impl._M_node._M_size);
  }
  std::__cxx11::list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::clear
            ((list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)this);
  pppVar1 = (this->all).
            super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all).
      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != pppVar1) {
    (this->all).
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = pppVar1;
  }
  return;
}

Assistant:

void c_polygon::destroy()
{
    for(iterator i=begin();i!=end();i++){
        i->destroy();
    }
    clear(); //remove all ply from this list
    all.clear();
}